

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.h
# Opt level: O1

void __thiscall JointActionObservationHistory::Print(JointActionObservationHistory *this)

{
  string local_28;
  
  SoftPrint_abi_cxx11_(&local_28,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_28._M_dataplus._M_p,local_28._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Print() const {std::cout << SoftPrint(); }